

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Oscilloscope.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Oscilloscope::AddLastPoint(ChFunction_Oscilloscope *this,double mx,double my)

{
  size_t sVar1;
  _List_node_base *p_Var2;
  
  if (mx < this->end_x) {
    std::__cxx11::list<double,_std::allocator<double>_>::clear(&this->values);
    this->amount = 0;
    this->end_x = 0.0;
  }
  this->end_x = mx;
  p_Var2 = (_List_node_base *)::operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)my;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  sVar1 = (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node._M_size;
  (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node._M_size =
       sVar1 + 1;
  if (this->amount < this->max_amount) {
    this->amount = this->amount + 1;
  }
  else {
    p_Var2 = (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node.
             super__List_node_base._M_next;
    (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node._M_size = sVar1
    ;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
  }
  if ((this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node._M_size ==
      (long)this->amount) {
    return;
  }
  __assert_fail("this->values.size() == this->amount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/motion_functions/ChFunction_Oscilloscope.cpp"
                ,0x2f,"void chrono::ChFunction_Oscilloscope::AddLastPoint(double, double)");
}

Assistant:

void ChFunction_Oscilloscope::AddLastPoint(double mx, double my) {
    if (mx < end_x)
        this->Reset();
    this->end_x = mx;
    this->values.push_back(my);
    if (this->amount < this->max_amount)
        this->amount++;
    else
        this->values.pop_front();

    assert(this->values.size() == this->amount);
}